

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

void __thiscall GetUniquePathTest_Default_Test::TestBody(GetUniquePathTest_Default_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  char *pcVar3;
  undefined1 local_118 [8];
  WithEnv withTestVar;
  WithEnv withForced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  psVar2 = &withForced.var._M_string_length;
  withTestVar.val.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withTestVar.val.field_2 + 8),"GPROF_TEST_PATH","");
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/var/log/some_file_name","");
  WithEnv::WithEnv((WithEnv *)local_118,(string *)((long)&withTestVar.val.field_2 + 8),
                   (string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if ((size_type *)withTestVar.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)local_48,"\"/var/log/some_file_name\"","GetTestPath()",
             (char (*) [24])"/var/log/some_file_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8));
  if ((size_type *)withTestVar.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)((long)&withTestVar.val.field_2 + 8));
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_68,(Message *)((long)&withTestVar.val.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (withTestVar.val.field_2._8_8_ != 0) {
      (**(code **)(*(long *)withTestVar.val.field_2._8_8_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/var/log/some_file_name","");
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),(string *)local_48);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),
             "AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)withTestVar.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)((long)&withTestVar.val.field_2 + 8));
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_48,(Message *)((long)&withTestVar.val.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if (withTestVar.val.field_2._8_8_ != 0) {
      (**(code **)(*(long *)withTestVar.val.field_2._8_8_ + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  setenv((char *)local_118,(char *)withTestVar.var.field_2._8_8_,1);
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"GPROF_TEST_PATH_USE_PID","");
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"1","");
  WithEnv::WithEnv((WithEnv *)((long)&withTestVar.val.field_2 + 8),(string *)local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/var/log/some_file_name","");
  AppendPID((string *)local_48,&local_68);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_78,"AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withForced.val.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(withForced.val.field_2._9_7_,withForced.val.field_2._M_local_buf[8]) != &local_88)
  {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(withForced.val.field_2._9_7_,withForced.val.field_2._M_local_buf[8])
                    ,local_88._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/var/log/some_file_name","");
  AppendPID((string *)local_48,&local_68);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_78,"AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withForced.val.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(withForced.val.field_2._9_7_,withForced.val.field_2._M_local_buf[8]) != &local_88)
  {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(withForced.val.field_2._9_7_,withForced.val.field_2._M_local_buf[8])
                    ,local_88._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&withTestVar.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_118);
  return;
}

Assistant:

TEST(GetUniquePathTest, Default) {
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  EXPECT_EQ(TEST_VAL, GetTestPath());

  // Now that we ran GetUniquePathFromEnv once, we can test "child"
  // case, which appends pid
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case - must include PID (will set the child flag)
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());

  // Test child case
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());
}